

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int unixRead(sqlite3_file *id,void *pBuf,int amt,sqlite3_int64 offset)

{
  sqlite3_io_methods *psVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int *piVar5;
  size_t __n;
  int iVar6;
  void *pvVar7;
  
  psVar1 = id[10].pMethods;
  if ((long)psVar1 - offset != 0 && offset <= (long)psVar1) {
    if (amt + offset <= (long)psVar1) {
      memcpy(pBuf,(void *)((long)&(id[0xd].pMethods)->iVersion + offset),(long)amt);
      return 0;
    }
    iVar3 = (int)((long)psVar1 - offset);
    __n = (size_t)iVar3;
    memcpy(pBuf,(void *)((long)&(id[0xd].pMethods)->iVersion + offset),__n);
    pBuf = (void *)((long)pBuf + __n);
    amt = amt - iVar3;
    offset = offset + __n;
  }
  iVar6 = 0;
  pvVar7 = pBuf;
  iVar3 = amt;
  do {
    uVar4 = (*aSyscall[9].pCurrent)((ulong)*(uint *)&id[3].pMethods,pvVar7,(long)iVar3,offset);
    if (iVar3 - uVar4 == 0) goto LAB_00131b56;
    if ((int)uVar4 < 0) {
      piVar5 = __errno_location();
      bVar2 = true;
      if (*piVar5 != 4) {
        *(int *)&id[4].pMethods = *piVar5;
        iVar6 = 0;
        goto LAB_00131b56;
      }
    }
    else if (uVar4 == 0) {
      bVar2 = false;
    }
    else {
      offset = offset + (ulong)(uVar4 & 0x7fffffff);
      iVar6 = iVar6 + uVar4;
      pvVar7 = (void *)((long)pvVar7 + (ulong)(uVar4 & 0x7fffffff));
      bVar2 = true;
      iVar3 = iVar3 - uVar4;
    }
  } while (bVar2);
  uVar4 = 0;
LAB_00131b56:
  uVar4 = uVar4 + iVar6;
  iVar3 = 0;
  if (amt - uVar4 != 0) {
    if ((int)uVar4 < 0) {
      if ((0x22 < (ulong)*(uint *)&id[4].pMethods) ||
         (iVar3 = 0x210a, (0x400000060U >> ((ulong)*(uint *)&id[4].pMethods & 0x3f) & 1) == 0)) {
        iVar3 = 0x10a;
      }
    }
    else {
      *(undefined4 *)&id[4].pMethods = 0;
      memset((void *)((long)pBuf + (ulong)uVar4),0,(long)(int)(amt - uVar4));
      iVar3 = 0x20a;
    }
  }
  return iVar3;
}

Assistant:

static int unixRead(
  sqlite3_file *id,
  void *pBuf,
  int amt,
  sqlite3_int64 offset
){
  unixFile *pFile = (unixFile *)id;
  int got;
  assert( id );
  assert( offset>=0 );
  assert( amt>0 );

  /* If this is a database file (not a journal, super-journal or temp
  ** file), the bytes in the locking range should never be read or written. */
#if 0
  assert( pFile->pPreallocatedUnused==0
       || offset>=PENDING_BYTE+512
       || offset+amt<=PENDING_BYTE
  );
#endif

#if SQLITE_MAX_MMAP_SIZE>0
  /* Deal with as much of this read request as possible by transferring
  ** data from the memory mapping using memcpy().  */
  if( offset<pFile->mmapSize ){
    if( offset+amt <= pFile->mmapSize ){
      memcpy(pBuf, &((u8 *)(pFile->pMapRegion))[offset], amt);
      return SQLITE_OK;
    }else{
      int nCopy = pFile->mmapSize - offset;
      memcpy(pBuf, &((u8 *)(pFile->pMapRegion))[offset], nCopy);
      pBuf = &((u8 *)pBuf)[nCopy];
      amt -= nCopy;
      offset += nCopy;
    }
  }
#endif

  got = seekAndRead(pFile, offset, pBuf, amt);
  if( got==amt ){
    return SQLITE_OK;
  }else if( got<0 ){
    /* pFile->lastErrno has been set by seekAndRead().
    ** Usually we return SQLITE_IOERR_READ here, though for some
    ** kinds of errors we return SQLITE_IOERR_CORRUPTFS.  The
    ** SQLITE_IOERR_CORRUPTFS will be converted into SQLITE_CORRUPT
    ** prior to returning to the application by the sqlite3ApiExit()
    ** routine.
    */
    switch( pFile->lastErrno ){
      case ERANGE:
      case EIO:
#ifdef ENXIO
      case ENXIO:
#endif
#ifdef EDEVERR
      case EDEVERR:
#endif
        return SQLITE_IOERR_CORRUPTFS;
    }
    return SQLITE_IOERR_READ;
  }else{
    storeLastErrno(pFile, 0);   /* not a system error */
    /* Unread parts of the buffer must be zero-filled */
    memset(&((char*)pBuf)[got], 0, amt-got);
    return SQLITE_IOERR_SHORT_READ;
  }
}